

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv__make_socketpair(int *fds,int flags)

{
  int iVar1;
  int *piVar2;
  uint in_ESI;
  int *in_RDI;
  int fd;
  int local_4;
  
  if (uv__make_socketpair::no_cloexec == 0) {
    iVar1 = socketpair(1,in_ESI | 0x80001,0,in_RDI);
    if (iVar1 == 0) {
      return 0;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x16) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    uv__make_socketpair::no_cloexec = 1;
  }
  iVar1 = socketpair(1,1,0,in_RDI);
  fd = (int)in_RDI;
  if (iVar1 == 0) {
    uv__cloexec(fd,in_ESI);
    uv__cloexec(fd,in_ESI);
    if ((in_ESI & 0x800) != 0) {
      uv__nonblock(fd,in_ESI);
      uv__nonblock(fd,in_ESI);
    }
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    local_4 = -*piVar2;
  }
  return local_4;
}

Assistant:

int uv__make_socketpair(int fds[2], int flags) {
#if defined(__linux__)
  static int no_cloexec;

  if (no_cloexec)
    goto skip;

  if (socketpair(AF_UNIX, SOCK_STREAM | UV__SOCK_CLOEXEC | flags, 0, fds) == 0)
    return 0;

  /* Retry on EINVAL, it means SOCK_CLOEXEC is not supported.
   * Anything else is a genuine error.
   */
  if (errno != EINVAL)
    return -errno;

  no_cloexec = 1;

skip:
#endif

  if (socketpair(AF_UNIX, SOCK_STREAM, 0, fds))
    return -errno;

  uv__cloexec(fds[0], 1);
  uv__cloexec(fds[1], 1);

  if (flags & UV__F_NONBLOCK) {
    uv__nonblock(fds[0], 1);
    uv__nonblock(fds[1], 1);
  }

  return 0;
}